

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *this,size_t node,size_t ilevel,size_t do_indent)

{
  size_t *psVar1;
  Tree *pTVar2;
  ulong uVar3;
  NodeType_e NVar4;
  size_t sVar5;
  code *pcVar6;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  error_flags eVar13;
  NodeScalar *pNVar14;
  csubstr *pcVar15;
  long lVar16;
  
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((~(int)pTVar2->m_buf[node].m_type.type & 0x28U) == 0) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x597d) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x597d) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: !m_tree->is_stream(node)",0x26,loc_00);
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_01.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  if ((pTVar2->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_02.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_02.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_02);
    }
    if ((pTVar2->m_buf[node].m_type.type & DOC) == NOTYPE) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_03.super_LineCol.col = 0;
      loc_03.super_LineCol.offset = SUB168(ZEXT816(0x597e) << 0x40,0);
      loc_03.super_LineCol.line = SUB168(ZEXT816(0x597e) << 0x40,8);
      loc_03.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_03.name.len = 0x65;
      error("check failed: m_tree->is_container(node) || m_tree->is_doc(node)",0x40,loc_03);
    }
  }
  bVar8 = Tree::is_root(this->m_tree,node);
  if (!bVar8) {
    pTVar2 = this->m_tree;
    bVar8 = Tree::has_parent(pTVar2,node);
    if (!bVar8) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_04.super_LineCol.col = 0;
      loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4beb) << 0x40,0);
      loc_04.super_LineCol.line = SUB168(ZEXT816(0x4beb) << 0x40,8);
      loc_04.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_04.name.len = 0x65;
      error("check failed: has_parent(node)",0x1e,loc_04);
    }
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_05.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
    }
    uVar3 = pTVar2->m_buf[node].m_parent;
    if ((uVar3 == 0xffffffffffffffff) || (pTVar2->m_cap <= uVar3)) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_06.super_LineCol.col = 0;
      loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_06.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_06.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
    }
    if ((pTVar2->m_buf[uVar3].m_type.type & MAP) == NOTYPE) {
      pTVar2 = this->m_tree;
      bVar8 = Tree::has_parent(pTVar2,node);
      if (!bVar8) {
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        loc_07.super_LineCol.col = 0;
        loc_07.super_LineCol.offset = SUB168(ZEXT816(0x4bea) << 0x40,0);
        loc_07.super_LineCol.line = SUB168(ZEXT816(0x4bea) << 0x40,8);
        loc_07.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_07.name.len = 0x65;
        error("check failed: has_parent(node)",0x1e,loc_07);
      }
      if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        loc_08.super_LineCol.col = 0;
        loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_08.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_08.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
      }
      uVar3 = pTVar2->m_buf[node].m_parent;
      if ((uVar3 == 0xffffffffffffffff) || (pTVar2->m_cap <= uVar3)) {
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        loc_09.super_LineCol.col = 0;
        loc_09.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_09.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_09.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_09.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_09);
      }
      if ((pTVar2->m_buf[uVar3].m_type.type & SEQ) == NOTYPE) {
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        loc_10.super_LineCol.col = 0;
        loc_10.super_LineCol.offset = SUB168(ZEXT816(0x597f) << 0x40,0);
        loc_10.super_LineCol.line = SUB168(ZEXT816(0x597f) << 0x40,8);
        loc_10.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_10.name.len = 0x65;
        error("check failed: m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node))"
              ,99,loc_10);
      }
    }
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_11.super_LineCol.col = 0;
    loc_11.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_11.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_11.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_11.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_11);
  }
  if ((pTVar2->m_buf[node].m_type.type & DOC) != NOTYPE) {
    _write_doc(this,node);
    bVar8 = Tree::has_children(this->m_tree,node);
    if (!bVar8) {
      return;
    }
    goto LAB_00191ead;
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_12.super_LineCol.col = 0;
    loc_12.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_12.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_12.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_12.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_12);
  }
  if ((pTVar2->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) goto LAB_00191ead;
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_13.super_LineCol.col = 0;
    loc_13.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_13.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_13.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_13.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_13);
  }
  if ((pTVar2->m_buf[node].m_type.type & MAP) == NOTYPE) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_14.super_LineCol.col = 0;
      loc_14.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_14.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_14.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_14.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_14);
    }
    if ((pTVar2->m_buf[node].m_type.type & SEQ) == NOTYPE) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_15.super_LineCol.col = 0;
      loc_15.super_LineCol.offset = SUB168(ZEXT816(0x598a) << 0x40,0);
      loc_15.super_LineCol.line = SUB168(ZEXT816(0x598a) << 0x40,8);
      loc_15.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_15.name.len = 0x65;
      error("check failed: m_tree->is_map(node) || m_tree->is_seq(node)",0x3a,loc_15);
    }
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_16.super_LineCol.col = 0;
    loc_16.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_16.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_16.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_16.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_16);
  }
  lVar16 = ilevel * do_indent * 2;
  lVar7 = lVar16;
  if ((pTVar2->m_buf[node].m_type.type & KEY) == NOTYPE) {
    bVar8 = Tree::is_root(this->m_tree,node);
    if (!bVar8) {
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
      }
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + lVar16;
      goto LAB_0019204f;
    }
    bVar8 = false;
  }
  else {
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
    }
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + lVar16;
    pNVar14 = Tree::keysc(this->m_tree,node);
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_18.super_LineCol.col = 0;
      loc_18.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_18.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_18.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_18.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_18);
    }
    _write(this,(int)pNVar14,(void *)(ulong)((uint)pTVar2->m_buf[node].m_type.type & 0x2aa2142),
           ilevel);
LAB_0019204f:
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    bVar8 = true;
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_19.super_LineCol.col = 0;
    loc_19.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_19.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_19.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_19.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_19);
  }
  NVar4 = pTVar2->m_buf[node].m_type.type;
  if ((NVar4 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar4 >> 0xb & 1) == 0) {
    bVar9 = false;
  }
  else {
    if (bVar8) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    pcVar15 = Tree::val_tag(this->m_tree,node);
    _write_tag(this,*pcVar15);
    bVar9 = true;
    bVar8 = true;
  }
  pTVar2 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    eVar13 = get_error_flags();
    if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar6 = (code *)swi(3);
      (*pcVar6)();
      return;
    }
    loc_20.super_LineCol.col = 0;
    loc_20.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_20.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_20.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_20.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_20);
  }
  NVar4 = pTVar2->m_buf[node].m_type.type;
  if ((NVar4 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar4 >> 9 & 1) != 0) {
    if (bVar8) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    pcVar15 = Tree::val_anchor(this->m_tree,node);
    sVar5 = pcVar15->len;
    bVar9 = true;
    if (pcVar15->str != (char *)0x0 && sVar5 != 0) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)pcVar15->str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar5;
    }
    bVar8 = true;
  }
  bVar11 = Tree::has_children(this->m_tree,node);
  pTVar2 = this->m_tree;
  bVar10 = pTVar2->m_cap <= node;
  if (bVar11) {
    if (bVar10 || node == 0xffffffffffffffff) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_21.super_LineCol.col = 0;
      loc_21.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_21.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_21.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_21.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_21);
    }
    bVar10 = bVar8;
    if ((pTVar2->m_buf[node].m_type.type & KEY) == NOTYPE) {
      bVar12 = Tree::is_root(this->m_tree,node);
      if ((!bVar12) && (bVar10 = true, bVar9)) {
        bVar10 = bVar8;
      }
    }
    else {
      bVar9 = true;
    }
    if ((bVar10) && (!bVar9)) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    if (bVar9) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      lVar16 = 1;
      do_indent = 1;
      goto LAB_001924ac;
    }
    do_indent = 0;
  }
  else {
    if (bVar10 || node == 0xffffffffffffffff) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_22.super_LineCol.col = 0;
      loc_22.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_22.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_22.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_22.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_22);
    }
    if ((pTVar2->m_buf[node].m_type.type & SEQ) == NOTYPE) {
      pTVar2 = this->m_tree;
      if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
        eVar13 = get_error_flags();
        if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        loc_23.super_LineCol.col = 0;
        loc_23.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_23.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_23.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_23.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_23);
      }
      if ((pTVar2->m_buf[node].m_type.type & MAP) == NOTYPE) goto LAB_001924b5;
      lVar16 = 4;
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),0x201158);
    }
    else {
      lVar16 = 4;
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),0x201153);
    }
LAB_001924ac:
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + lVar16;
  }
LAB_001924b5:
  if (!bVar11) {
    return;
  }
LAB_00191ead:
  bVar8 = Tree::is_root(this->m_tree,node);
  if (!bVar8) {
    pTVar2 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
      eVar13 = get_error_flags();
      if (((eVar13 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      loc_17.super_LineCol.col = 0;
      loc_17.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_17.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_17.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_17.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_17);
    }
    if ((pTVar2->m_buf[node].m_type.type & DOC) == NOTYPE) {
      ilevel = ilevel + 1;
    }
  }
  _do_visit_block_container(this,node,ilevel,do_indent);
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block(size_t node, size_t ilevel, size_t do_indent)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));
    RepC ind = indent_to(do_indent * ilevel);

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space
        bool nl = false;  // write a newline

        if(m_tree->has_key(node))
        {
            this->Writer::_do_write(ind);
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }
        else if(!m_tree->is_root(node))
        {
            this->Writer::_do_write(ind);
            this->Writer::_do_write('-');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_children(node))
        {
            if(m_tree->has_key(node))
                nl = true;
            else
                if(!m_tree->is_root(node) && !nl)
                    spc = true;
        }
        else
        {
            if(m_tree->is_seq(node))
                this->Writer::_do_write(" []\n");
            else if(m_tree->is_map(node))
                this->Writer::_do_write(" {}\n");
            return;
        }

        if(spc && !nl)
            this->Writer::_do_write(' ');

        do_indent = 0;
        if(nl)
        {
            this->Writer::_do_write('\n');
            do_indent = 1;
        }
    } // container

    size_t next_level = ilevel + 1;
    if(m_tree->is_root(node) || m_tree->is_doc(node))
        next_level = ilevel; // do not indent at top level

    _do_visit_block_container(node, next_level, do_indent);
}